

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void wtree_per(wtree_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  long lVar1;
  uint uVar2;
  wave_object pwVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  uint uVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *local_70;
  long local_68;
  
  if (0 < len_cA) {
    pwVar3 = wt->wave;
    uVar2 = pwVar3->lpd_len;
    uVar11 = (int)uVar2 / 2;
    lVar14 = (long)N;
    iVar8 = N % 2;
    pdVar5 = inp + lVar14 + -1;
    lVar17 = (long)(int)uVar11;
    local_70 = inp + lVar14 + lVar17;
    local_68 = lVar14 - lVar17;
    iVar13 = ~N + uVar11;
    uVar15 = 0;
    lVar18 = lVar17;
    uVar4 = uVar11;
    do {
      cA[uVar15] = 0.0;
      cD[uVar15] = 0.0;
      if (0 < (int)uVar2) {
        lVar19 = 0;
        lVar6 = 0;
        lVar16 = 0;
        pdVar12 = local_70;
        do {
          lVar9 = (lVar17 + uVar15 * 2) - lVar16;
          lVar1 = lVar18 + lVar19;
          if ((lVar1 < lVar14 && lVar17 <= lVar1) || (uVar4 + (int)lVar19 < uVar11)) {
            pdVar7 = pwVar3->lpd;
LAB_00103f30:
            pdVar7 = pdVar7 + lVar16;
            pdVar10 = inp + lVar9;
LAB_00103f38:
            cA[uVar15] = *pdVar7 * *pdVar10 + cA[uVar15];
            cD[uVar15] = *(double *)((long)pwVar3->hpd + lVar6) * *pdVar10 + cD[uVar15];
          }
          else {
            if ((iVar8 == 0) && (lVar1 < 0)) {
              pdVar7 = pwVar3->lpd + lVar16;
              pdVar10 = pdVar12;
              goto LAB_00103f38;
            }
            pdVar10 = pdVar5;
            if ((iVar8 == 1) && (lVar1 < 0)) {
              if (lVar18 + lVar19 == -1) {
                pdVar7 = pwVar3->lpd + lVar16;
              }
              else {
                pdVar7 = pwVar3->lpd + lVar16;
                pdVar10 = pdVar5 + lVar9 + 2;
              }
              goto LAB_00103f38;
            }
            if ((iVar8 == 0) && (lVar14 <= lVar1)) {
              pdVar7 = pwVar3->lpd;
              lVar9 = lVar9 - lVar14;
              goto LAB_00103f30;
            }
            if ((iVar8 == 1) && (lVar14 <= lVar1)) {
              if (local_68 == lVar19) {
                pdVar7 = (double *)((long)pwVar3->lpd + lVar6);
              }
              else {
                pdVar7 = pwVar3->lpd + lVar16;
                pdVar10 = inp + (iVar13 + (int)lVar19);
              }
              goto LAB_00103f38;
            }
          }
          lVar16 = lVar16 + 1;
          lVar6 = lVar6 + 8;
          pdVar12 = pdVar12 + -1;
          lVar19 = lVar19 + -1;
        } while (-(ulong)uVar2 != lVar19);
      }
      uVar15 = uVar15 + 1;
      local_70 = local_70 + 2;
      local_68 = local_68 + -2;
      lVar18 = lVar18 + 2;
      uVar4 = uVar4 + 2;
      iVar13 = iVar13 + 2;
    } while (uVar15 != (uint)len_cA);
  }
  return;
}

Assistant:

static void wtree_per(wtree_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int l, l2, isodd, i, t, len_avg;

	len_avg = wt->wave->lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0 && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l + N];
				cD[i] += wt->wave->hpd[l] * inp[t - l + N];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					cA[i] += wt->wave->lpd[l] * inp[t - l + N + 1];
					cD[i] += wt->wave->hpd[l] * inp[t - l + N + 1];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				cA[i] += wt->wave->lpd[l] * inp[t - l - N];
				cD[i] += wt->wave->hpd[l] * inp[t - l - N];
			}
			else if ((t - l) >= N && isodd == 1) {
				if (t - l != N) {
					cA[i] += wt->wave->lpd[l] * inp[t - l - (N + 1)];
					cD[i] += wt->wave->hpd[l] * inp[t - l - (N + 1)];
				}
				else {
					cA[i] += wt->wave->lpd[l] * inp[N - 1];
					cD[i] += wt->wave->hpd[l] * inp[N - 1];
				}
			}

		}
	}



}